

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressRleLiteralsBlock(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = ((ulong)(0x1f < srcSize) + 1) - (ulong)(srcSize < 0x1000);
  if (dstCapacity < 4) {
    __assert_fail("dstCapacity >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4a4d,
                  "size_t ZSTD_compressRleLiteralsBlock(void *, size_t, const void *, size_t)");
  }
  iVar1 = allBytesIdentical(src,srcSize);
  if (iVar1 != 0) {
    lVar3 = lVar2 + 1;
    iVar1 = (int)lVar3;
    if (iVar1 == 3) {
      *(uint *)dst = (int)srcSize << 4 | 0xd;
    }
    else if (iVar1 == 2) {
      *(ushort *)dst = (ushort)((int)srcSize << 4) | 5;
    }
    else {
      *(char *)dst = (char)srcSize * '\b' + '\x01';
    }
    *(undefined1 *)((long)dst + lVar3) = *src;
    return (ulong)((int)lVar2 + 2);
  }
  __assert_fail("allBytesIdentical(src, srcSize)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4a4e,"size_t ZSTD_compressRleLiteralsBlock(void *, size_t, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_compressRleLiteralsBlock (void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    BYTE* const ostart = (BYTE*)dst;
    U32   const flSize = 1 + (srcSize>31) + (srcSize>4095);

    assert(dstCapacity >= 4); (void)dstCapacity;
    assert(allBytesIdentical(src, srcSize));

    switch(flSize)
    {
        case 1: /* 2 - 1 - 5 */
            ostart[0] = (BYTE)((U32)set_rle + (srcSize<<3));
            break;
        case 2: /* 2 - 2 - 12 */
            MEM_writeLE16(ostart, (U16)((U32)set_rle + (1<<2) + (srcSize<<4)));
            break;
        case 3: /* 2 - 2 - 20 */
            MEM_writeLE32(ostart, (U32)((U32)set_rle + (3<<2) + (srcSize<<4)));
            break;
        default:   /* not necessary : flSize is {1,2,3} */
            assert(0);
    }

    ostart[flSize] = *(const BYTE*)src;
    DEBUGLOG(5, "RLE : Repeated Literal (%02X: %u times) -> %u bytes encoded", ((const BYTE*)src)[0], (U32)srcSize, (U32)flSize + 1);
    return flSize+1;
}